

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O1

Data * __thiscall
QTzTimeZonePrivate::data
          (Data *__return_storage_ptr__,QTzTimeZonePrivate *this,qint64 forMSecsSinceEpoch)

{
  QTzTransitionRule *pQVar1;
  long lVar2;
  Data *pDVar3;
  QTzTransitionTime *pQVar4;
  QTzTransitionRule *pQVar5;
  undefined1 *puVar6;
  int iVar7;
  int iVar8;
  Data *pDVar9;
  QTzTransitionTime *pQVar10;
  undefined4 uVar11;
  ulong uVar12;
  ulong uVar14;
  undefined8 uVar15;
  undefined1 *puVar16;
  long in_FS_OFFSET;
  QTzTransitionRule rule;
  QArrayDataPointer<QTimeZonePrivate::Data> local_48;
  long local_28;
  ulong uVar13;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->cached_data).m_posixRule.d.size == 0) ||
     ((lVar2 = (this->cached_data).m_tranTimes.d.size, lVar2 != 0 &&
      (forMSecsSinceEpoch <= (this->cached_data).m_tranTimes.d.ptr[lVar2 + -1].atMSecsSinceEpoch))))
  {
LAB_0040ac50:
    uVar13 = (this->cached_data).m_tranTimes.d.size;
    if (uVar13 == 0) {
      (__return_storage_ptr__->abbreviation).d.d = (Data *)0x0;
      (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->abbreviation).d.size = 0;
      __return_storage_ptr__->atMSecsSinceEpoch = -0x8000000000000000;
      __return_storage_ptr__->offsetFromUtc = -0x80000000;
      __return_storage_ptr__->standardTimeOffset = -0x80000000;
      __return_storage_ptr__->daylightTimeOffset = -0x80000000;
    }
    else {
      pQVar4 = (this->cached_data).m_tranTimes.d.ptr;
      pQVar10 = pQVar4;
      do {
        uVar12 = uVar13 >> 1;
        uVar14 = uVar12;
        if (pQVar10[uVar12].atMSecsSinceEpoch <= forMSecsSinceEpoch) {
          uVar14 = ~uVar12 + uVar13;
          pQVar10 = pQVar10 + uVar12 + 1;
        }
        uVar13 = uVar14;
      } while (0 < (long)uVar14);
      if (pQVar10 == pQVar4) {
        uVar15._0_4_ = (this->cached_data).m_preZoneRule.stdOffset;
        uVar15._4_4_ = (this->cached_data).m_preZoneRule.dstOffset;
        uVar11 = *(undefined4 *)&(this->cached_data).m_preZoneRule.abbreviationIndex;
      }
      else {
        pQVar5 = (this->cached_data).m_tranRules.d.ptr;
        pQVar1 = pQVar5 + pQVar10[-1].ruleIndex;
        uVar15._0_4_ = pQVar1->stdOffset;
        uVar15._4_4_ = pQVar1->dstOffset;
        uVar11 = *(undefined4 *)&pQVar5[pQVar10[-1].ruleIndex].abbreviationIndex;
      }
      rule._8_4_ = uVar11;
      rule.stdOffset = (int)uVar15;
      rule.dstOffset = (int)((ulong)uVar15 >> 0x20);
      dataFromRule(__return_storage_ptr__,this,rule,forMSecsSinceEpoch);
    }
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    getPosixTransitions((QList<QTimeZonePrivate::Data> *)&local_48,this,forMSecsSinceEpoch);
    pDVar9 = local_48.ptr;
    puVar16 = (undefined1 *)local_48.size;
    while (puVar6 = puVar16, 0 < (long)puVar6) {
      puVar16 = (undefined1 *)((ulong)puVar6 >> 1);
      if (pDVar9[(long)puVar16].atMSecsSinceEpoch <= forMSecsSinceEpoch) {
        pDVar9 = pDVar9 + (long)(puVar16 + 1);
        puVar16 = puVar6 + ~(ulong)puVar16;
      }
    }
    if (local_48.ptr < pDVar9) {
      *(undefined1 **)&__return_storage_ptr__->offsetFromUtc = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&__return_storage_ptr__->daylightTimeOffset = &DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->abbreviation).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      __return_storage_ptr__->atMSecsSinceEpoch = (qint64)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->abbreviation).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
LAB_0040abd7:
      pDVar9 = pDVar9 + -1;
    }
    else {
      if ((local_48.ptr + local_48.size <= pDVar9) || ((this->cached_data).m_tranTimes.d.size != 0))
      {
        QArrayDataPointer<QTimeZonePrivate::Data>::~QArrayDataPointer(&local_48);
        goto LAB_0040ac50;
      }
      *(undefined1 **)&__return_storage_ptr__->offsetFromUtc = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&__return_storage_ptr__->daylightTimeOffset = &DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->abbreviation).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      __return_storage_ptr__->atMSecsSinceEpoch = (qint64)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->abbreviation).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      if (local_48.ptr < pDVar9) goto LAB_0040abd7;
    }
    pDVar3 = (pDVar9->abbreviation).d.d;
    (__return_storage_ptr__->abbreviation).d.d = pDVar3;
    (__return_storage_ptr__->abbreviation).d.ptr = (pDVar9->abbreviation).d.ptr;
    (__return_storage_ptr__->abbreviation).d.size = (pDVar9->abbreviation).d.size;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> +
           1);
      UNLOCK();
    }
    iVar7 = pDVar9->offsetFromUtc;
    iVar8 = pDVar9->standardTimeOffset;
    __return_storage_ptr__->atMSecsSinceEpoch = pDVar9->atMSecsSinceEpoch;
    __return_storage_ptr__->offsetFromUtc = iVar7;
    __return_storage_ptr__->standardTimeOffset = iVar8;
    __return_storage_ptr__->daylightTimeOffset = pDVar9->daylightTimeOffset;
    __return_storage_ptr__->atMSecsSinceEpoch = forMSecsSinceEpoch;
    QArrayDataPointer<QTimeZonePrivate::Data>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QTimeZonePrivate::Data QTzTimeZonePrivate::data(qint64 forMSecsSinceEpoch) const
{
    // If the required time is after the last transition (or there were none)
    // and we have a POSIX rule, then use it:
    if (!cached_data.m_posixRule.isEmpty()
        && (tranCache().isEmpty() || tranCache().last().atMSecsSinceEpoch < forMSecsSinceEpoch)) {
        QList<Data> posixTrans = getPosixTransitions(forMSecsSinceEpoch);
        auto it = std::partition_point(posixTrans.cbegin(), posixTrans.cend(),
                                       [forMSecsSinceEpoch] (const Data &at) {
                                           return at.atMSecsSinceEpoch <= forMSecsSinceEpoch;
                                       });
        // Use most recent, if any in the past; or the first if we have no other rules:
        if (it > posixTrans.cbegin() || (tranCache().isEmpty() && it < posixTrans.cend())) {
            Data data = *(it > posixTrans.cbegin() ? it - 1 : it);
            data.atMSecsSinceEpoch = forMSecsSinceEpoch;
            return data;
        }
    }
    if (tranCache().isEmpty()) // Only possible if !isValid()
        return {};

    // Otherwise, use the rule for the most recent or first transition:
    auto last = std::partition_point(tranCache().cbegin(), tranCache().cend(),
                                     [forMSecsSinceEpoch] (QTzTransitionTime at) {
                                         return at.atMSecsSinceEpoch <= forMSecsSinceEpoch;
                                     });
    if (last == tranCache().cbegin())
        return dataFromRule(cached_data.m_preZoneRule, forMSecsSinceEpoch);

    --last;
    return dataFromRule(cached_data.m_tranRules.at(last->ruleIndex), forMSecsSinceEpoch);
}